

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

String * asl::Url::encode(String *__return_storage_ptr__,String *q0_,bool component)

{
  byte c_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  byte *pbVar4;
  String *pSVar5;
  char *chars;
  byte c;
  int local_30;
  int i;
  String *q0;
  bool component_local;
  String *q0__local;
  String *q;
  
  iVar3 = asl::String::length(q0_);
  asl::String::String(__return_storage_ptr__,iVar3,0);
  local_30 = 0;
  do {
    iVar3 = asl::String::length(q0_);
    if (iVar3 <= local_30) {
      return __return_storage_ptr__;
    }
    pbVar4 = (byte *)asl::String::operator[](q0_,local_30);
    c_00 = *pbVar4;
    iVar3 = isalnum((uint)c_00);
    if (iVar3 == 0) {
      chars = "-_.!~*\'();/?:@&=+$,#";
      if (component) {
        chars = "-_.!~*\'()";
      }
      bVar1 = isanyof(c_00,chars);
      if (bVar1) goto LAB_00140fe1;
      pSVar5 = asl::String::operator<<(__return_storage_ptr__,'%');
      cVar2 = hexNibble((uint)(c_00 >> 4));
      pSVar5 = asl::String::operator<<(pSVar5,cVar2);
      cVar2 = hexNibble(c_00 & 0xf);
      asl::String::operator<<(pSVar5,cVar2);
    }
    else {
LAB_00140fe1:
      asl::String::operator<<(__return_storage_ptr__,c_00);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

String Url::encode(const String& q0_, bool component)
{
#ifdef ASL_ANSI
	String q0 = localToUtf8(q0_);
#else
	const String& q0 = q0_;
#endif

	String q(q0.length(), 0);
	for (int i = 0; i < q0.length(); i++)
	{
		byte c = *(byte*)&q0[i];
		if (!isalnum(c) && !isanyof(c, component ? "-_.!~*'()" : "-_.!~*'();/?:@&=+$,#"))
			q << '%' << hexNibble(c >> 4) << hexNibble(c & 0x0f);
		else
			q << (char)c;
	}
	return q;
}